

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall
Lodtalk::StackInterpreter::pushLongReceiverVariable(StackInterpreter *this,size_t receiverVarIndex)

{
  StackMemory *pSVar1;
  long *plVar2;
  ulong uVar3;
  undefined8 uVar4;
  uint8_t *puVar5;
  size_t sVar6;
  int iVar7;
  StackFrame previousFrame;
  StackFrame local_20;
  
  if (receiverVarIndex < 6) {
    iVar7 = classIndexOf((Oop)*(anon_union_8_4_0eb573b0_for_Oop_0 *)
                               ((this->stack->stackFrame).framePointer + -0x20));
    if (iVar7 == 0x5c) {
      pSVar1 = this->stack;
      plVar2 = (long *)(pSVar1->stackFrame).framePointer;
      uVar3 = *(ulong *)(plVar2[-4] + 8);
      if ((uVar3 & 1) != 0) {
        if (receiverVarIndex == 1) {
          if ((long *)(uVar3 - 1) != plVar2) goto LAB_00153870;
          sVar6 = this->pc;
          puVar5 = (pSVar1->stackFrame).stackPointer;
          (pSVar1->stackFrame).stackPointer = puVar5 + -8;
          *(size_t *)(puVar5 + -8) = sVar6 * 2 + 1;
        }
        else {
          if (receiverVarIndex != 0) goto LAB_00153870;
          local_20.framePointer = *(uint8_t **)(uVar3 - 1);
          if (local_20.framePointer == (uint8_t *)0x0) {
            puVar5 = (pSVar1->stackFrame).stackPointer;
            (pSVar1->stackFrame).stackPointer = puVar5 + -8;
            *(undefined8 **)(puVar5 + -8) = &NilObject;
          }
          else {
            local_20.stackPointer =
                 (uint8_t *)(uVar3 + (ulong)(*(uint *)(uVar3 - 0x11) & 0xff) * 8 + 0x17);
            StackFrame::ensureFrameIsMarried(&local_20,this->context);
            uVar4 = *(undefined8 *)(local_20.framePointer + -0x18);
            puVar5 = (this->stack->stackFrame).stackPointer;
            (this->stack->stackFrame).stackPointer = puVar5 + -8;
            *(undefined8 *)(puVar5 + -8) = uVar4;
          }
        }
        return;
      }
    }
  }
LAB_00153870:
  pushReceiverVariable(this,receiverVarIndex);
  return;
}

Assistant:

void pushLongReceiverVariable(size_t receiverVarIndex)
    {
        if(receiverVarIndex <= 5 && classIndexOf(currentReceiver()) == SCI_Context)
        {
            auto context = reinterpret_cast<Context*> (currentReceiver().pointer);
            if (!context->isMarriedOrWidowed())
                return pushReceiverVariable(receiverVarIndex);

            // TODO: Perform expensive check for widowed context.
            auto contextFP = context->sender.pointer - 1;
            StackFrame contextFrame(contextFP);
            auto prevFP = contextFrame.getPrevFramePointer();

            switch (receiverVarIndex)
            {
            case Context::SenderIndex:
            {
                if (!prevFP)
                {
                    pushOop(nilOop());
                }
                else
                {
                    auto previousFrame = contextFrame.getPreviousFrame();
                    previousFrame.ensureFrameIsMarried(this->context);
                    pushOop(previousFrame.getThisContext());
                }
                return;
            }
                break;
            case Context::PCIndex:
                if (contextFP == stack->getFramePointer())
                    return pushSmallIntegerObject(pc);
                break;
            case Context::StackPointerIndex:
                break;
            }
            auto value = getInstanceVariable(receiverVarIndex);
            //printf("get context var %d %p\n", (int)receiverVarIndex, value.pointer);
        }

        pushReceiverVariable(receiverVarIndex);
    }